

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O0

int rfc5444_seqno_difference(uint16_t seqno1,uint16_t seqno2)

{
  undefined4 local_10;
  int diff;
  uint16_t seqno2_local;
  uint16_t seqno1_local;
  
  local_10 = (uint)seqno1 - (uint)seqno2;
  if (local_10 < 0x8001) {
    if (local_10 < -0x8000) {
      local_10 = local_10 + 0x10000;
    }
  }
  else {
    local_10 = local_10 + -0x10000;
  }
  return local_10;
}

Assistant:

int
rfc5444_seqno_difference(uint16_t seqno1, uint16_t seqno2) {
  int diff = (int)seqno1 - (int)(seqno2);

  // overflow ?
  if (diff > (1 << 15)) {
    diff -= (1 << 16);
  }
  else if (diff < -(1 << 15)) {
    diff += (1 << 16);
  }
  return diff;
}